

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::PIQBase::VerifyGetProgramResourceLocation
          (PIQBase *this,GLuint program,GLenum programInterface,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *locations,string *name,long *error)

{
  _Rb_tree_color _Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_color *p_Var3;
  char *format;
  
  _Var1 = glu::CallLogWrapper::glGetProgramResourceLocation
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                     programInterface,(name->_M_dataplus)._M_p);
  if ((int)_Var1 < 0) {
    format = "ERROR: Got %d, expected not less than 0\n";
LAB_00c311e4:
    anon_unknown_0::Output(format,(ulong)_Var1);
    *error = -1;
  }
  else {
    for (p_Var2 = (locations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(locations->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (p_Var2[2]._M_color == _Var1) {
        format = "ERROR: Duplicated value found: %d\n";
        goto LAB_00c311e4;
      }
    }
    p_Var3 = (_Rb_tree_color *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](locations,name);
    *p_Var3 = _Var1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceLocation(GLuint program, GLenum		   programInterface,
														 std::map<std::string, GLint>& locations,
														 const std::string& name, long& error)
	{
		GLint res = glGetProgramResourceLocation(program, programInterface, name.c_str());
		if (res < 0)
		{
			Output("ERROR: Got %d, expected not less than 0\n", res);
			error = ERROR;
			return;
		}
		std::map<std::string, GLint>::iterator it = locations.begin();
		while (it != locations.end())
		{
			if (it->second == res)
			{
				Output("ERROR: Duplicated value found: %d\n", res);
				error = ERROR;
				return;
			}
			++it;
		}
		locations[name] = res;
	}